

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<TPZPostProcVar>::~TPZVec(TPZVec<TPZPostProcVar> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TPZVec_02541078;
  if ((in_RDI[1] != 0) && (lVar1 = in_RDI[1], lVar1 != 0)) {
    lVar2 = *(long *)(lVar1 + -8);
    for (lVar3 = lVar1 + lVar2 * 0x38; lVar1 != lVar3; lVar3 = lVar3 + -0x38) {
      TPZPostProcVar::~TPZPostProcVar((TPZPostProcVar *)0x1cb5160);
    }
    operator_delete__((void *)(lVar1 + -8),lVar2 * 0x38 + 8);
  }
  return;
}

Assistant:

inline TPZVec<T>::~TPZVec() {
	if( fStore )
	{
		delete [] fStore;
	}
}